

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O1

void __thiscall Clasp::SolverStrategies::prepare(SolverStrategies *this)

{
  if (((ulong)*this >> 0x33 & 1) != 0) {
    *this = (SolverStrategies)((ulong)*this & 0xfffbf80700000000 | 0x60000000000);
  }
  return;
}

Assistant:

void SolverStrategies::prepare() {
	if (search == SolverStrategies::no_learning) {
		compress    = 0;
		saveProgress= 0;
		reverseArcs = 0;
		otfs        = 0;
		updateLbd   = 0;
		ccMinAntes  = SolverStrategies::no_antes;
		bumpVarAct  = 0;
	}
}